

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

double __thiscall
MADPComponentDiscreteStates::GetInitialStateProbability(MADPComponentDiscreteStates *this,Index sI)

{
  StateDistributionVector *pSVar1;
  reference pvVar2;
  ostream *poVar3;
  E *pEVar4;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_188,"MADPComponentDiscreteStates::GetInitialStateProbability(");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,") - Error: not initialized. ");
    std::endl<char,std::char_traits<char>>(poVar3);
    pEVar4 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar4,&ss);
    __cxa_throw(pEVar4,&E::typeinfo,E::~E);
  }
  pSVar1 = this->_m_initialStateDistribution;
  if ((ulong)sI <
      (ulong)((long)(pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(&pSVar1->super_SDV,(ulong)sI);
    return *pvVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_188,
                  "MultiAgentDecisionProcess::GetInitialStateProbability - ERROR GetInitialStateProbability: index out of bounds"
                 );
  pEVar4 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar4,&ss);
  __cxa_throw(pEVar4,&E::typeinfo,E::~E);
}

Assistant:

double MADPComponentDiscreteStates::GetInitialStateProbability(Index sI) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteStates::GetInitialStateProbability("<< 
        sI<<") - Error: not initialized. " <<endl;
        throw E(ss);
    }
    
    if(sI < _m_initialStateDistribution->size() )
    {
        if(DEBUG_MADP_DSTATES)    cout << "MultiAgentDecisionProcess::GetInitialStateProbability - index "<<sI<<" is okay, size is "<<_m_initialStateDistribution->size() <<endl;
        return(_m_initialStateDistribution->at(sI));
    }
    //else
    stringstream ss;
    ss << "MultiAgentDecisionProcess::GetInitialStateProbability - ERROR GetInitialStateProbability: index out of bounds";
    throw E(ss);
}